

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  int iVar1;
  uint uVar2;
  expkind eVar3;
  Instruction *pIVar4;
  uint uVar5;
  
  pIVar4 = fs->f->code;
  iVar1 = (e->u).info;
  luaY_checklimit(fs,nresults + 1,0xff,"multiple results");
  uVar2 = pIVar4[iVar1];
  uVar5 = (nresults + 1) * 0x1000000;
  eVar3 = e->k;
  pIVar4[iVar1] = uVar5 | uVar2 & 0xffffff;
  if (eVar3 != VCALL) {
    pIVar4[iVar1] = (uint)fs->freereg << 7 | uVar5 | uVar2 & 0xff807f;
    luaK_checkstack(fs,1);
    fs->freereg = fs->freereg + '\x01';
  }
  return;
}

Assistant:

void luaK_setreturns (FuncState *fs, expdesc *e, int nresults) {
  Instruction *pc = &getinstruction(fs, e);
  luaY_checklimit(fs, nresults + 1, MAXARG_C, "multiple results");
  if (e->k == VCALL)  /* expression is an open function call? */
    SETARG_C(*pc, nresults + 1);
  else {
    lua_assert(e->k == VVARARG);
    SETARG_C(*pc, nresults + 1);
    SETARG_A(*pc, fs->freereg);
    luaK_reserveregs(fs, 1);
  }
}